

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptArray::ArraySegmentSpliceHelper<void*>
               (JavascriptArray *pnewArr,SparseArraySegment<void_*> *seg,Type *prev,uint32 start,
               uint32 deleteLen,Var *insertArgs,uint32 insertLen,Recycler *recycler)

{
  Type *addr;
  Type TVar1;
  Type TVar2;
  uint uVar3;
  SparseArraySegmentBase *pSVar4;
  _func_int **pp_Var5;
  code *pcVar6;
  bool bVar7;
  SparseArraySegmentBase *pSVar8;
  undefined4 *puVar9;
  uint32 minValue;
  uint uVar10;
  ulong uVar11;
  ulong dstCount;
  uint uVar12;
  uint uVar13;
  
  TVar1 = (seg->super_SparseArraySegmentBase).left;
  TVar2 = (seg->super_SparseArraySegmentBase).length;
  uVar13 = TVar2 + TVar1;
  if (deleteLen + start < uVar13) {
    uVar13 = deleteLen + start;
  }
  uVar10 = (TVar2 - (uVar13 - start)) + insertLen;
  uVar13 = uVar13 - start;
  if (uVar13 != 0) {
    addr = &pnewArr->head;
    pSVar4 = (pnewArr->head).ptr;
    bVar7 = IsInlineSegment(pSVar4,pnewArr);
    SetLastUsedSegment(pnewArr,(pnewArr->head).ptr);
    pSVar8 = &SparseArraySegment<void_*>::CopySegment
                        (recycler,(SparseArraySegment<void_*> *)(pnewArr->head).ptr,0,seg,start,
                         uVar13)->super_SparseArraySegmentBase;
    Memory::Recycler::WBSetBit((char *)addr);
    (pnewArr->head).ptr = pSVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    if ((bVar7) && (pSVar4 != addr->ptr)) {
      (*(pnewArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                (pnewArr,pSVar4,0);
    }
  }
  if (uVar10 == 0) {
    seg = (SparseArraySegment<void_*> *)(seg->super_SparseArraySegmentBase).next.ptr;
  }
  else {
    uVar12 = start - TVar1;
    uVar3 = (seg->super_SparseArraySegmentBase).size;
    minValue = uVar10 - uVar3;
    if (uVar3 <= uVar10 && minValue != 0) {
      pSVar4 = (seg->super_SparseArraySegmentBase).next.ptr;
      if (pSVar4 == (SparseArraySegmentBase *)0x0) {
        seg = SparseArraySegment<void_*>::GrowByMin(seg,recycler,minValue);
      }
      else {
        seg = SparseArraySegment<void_*>::GrowByMinMax
                        (seg,recycler,minValue,
                         (pSVar4->left + insertLen) -
                         (uVar3 + deleteLen + (seg->super_SparseArraySegmentBase).left));
      }
      ValidateSegment<void*>(seg);
    }
    uVar11 = (ulong)uVar12;
    dstCount = (ulong)insertLen;
    if (uVar13 != insertLen) {
      Memory::
      MoveArray<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
                ((WriteBarrierPtr<void> *)
                 (&(&seg->super_SparseArraySegmentBase)[1].left + uVar11 * 2 + dstCount * 2),
                 (WriteBarrierPtr<void> *)
                 (&(&seg->super_SparseArraySegmentBase)[1].left + uVar11 * 2 + (ulong)uVar13 * 2),
                 (ulong)((seg->super_SparseArraySegmentBase).length - (uVar12 + uVar13)));
      if (uVar10 < (seg->super_SparseArraySegmentBase).length) {
        SparseArraySegment<void_*>::Truncate(seg,(seg->super_SparseArraySegmentBase).left + uVar10);
      }
      (seg->super_SparseArraySegmentBase).length = uVar10;
      SparseArraySegmentBase::CheckLengthvsSize(&seg->super_SparseArraySegmentBase);
    }
    if (insertLen != 0) {
      pp_Var5 = (pnewArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
      if ((pp_Var5 == (_func_int **)VirtualTableInfo<Js::JavascriptNativeIntArray>::Address) ||
         (pp_Var5 == (_func_int **)VirtualTableInfo<Js::JavascriptNativeFloatArray>::Address)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x1c47,
                                    "(!VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(pnewArr) && !VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(pnewArr))"
                                    ,
                                    "!VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(pnewArr) && !VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(pnewArr)"
                                   );
        if (!bVar7) {
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar9 = 0;
      }
      Memory::CopyArray<void*,Memory::WriteBarrierPtr<void>,Memory::Recycler>
                ((void **)(&(&seg->super_SparseArraySegmentBase)[1].left + uVar11 * 2),dstCount,
                 insertArgs,dstCount);
    }
  }
  Memory::Recycler::WBSetBit((char *)prev);
  *(SparseArraySegment<void_*> **)prev = seg;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(prev);
  return;
}

Assistant:

void JavascriptArray::ArraySegmentSpliceHelper(
        JavascriptArray *pnewArr, SparseArraySegment<T> *seg, Field(SparseArraySegment<T>*) *prev,
        uint32 start, uint32 deleteLen, Var* insertArgs, uint32 insertLen, Recycler *recycler)
    {
        // book keeping variables
        uint32 relativeStart    = start - seg->left;  // This will be different from start when head->left is non zero -
                                                      //(Missing elements at the beginning)

        uint32 headDeleteLen    = min(start + deleteLen , seg->left + seg->length) - start;   // actual number of elements to delete in
                                                                                              // head if deleteLen overflows the length of head

        uint32 newHeadLen       = seg->length - headDeleteLen + insertLen;     // new length of the head after splice

        // Save the deleted elements
        if (headDeleteLen != 0)
        {
            SparseArraySegmentBase *oldHead = pnewArr->head;
            bool isInlineSegment = JavascriptArray::IsInlineSegment(oldHead, pnewArr);
            pnewArr->InvalidateLastUsedSegment();
            pnewArr->head = SparseArraySegment<T>::CopySegment(recycler, SparseArraySegment<T>::From(pnewArr->head), 0, seg, start, headDeleteLen);
            if (isInlineSegment && oldHead != pnewArr->head)
            {
                pnewArr->ClearElements(oldHead, 0);
            }
        }

        if (newHeadLen != 0)
        {
            if (seg->size < newHeadLen)
            {
                if (seg->next)
                {
                    // If we have "next", require that we haven't adjusted next segments left yet.
                    seg = seg->GrowByMinMax(recycler, newHeadLen - seg->size, seg->next->left - deleteLen + insertLen - seg->left - seg->size);
                }
                else
                {
                    seg = seg->GrowByMin(recycler, newHeadLen - seg->size);
                }
#ifdef VALIDATE_ARRAY
                ValidateSegment(seg);
#endif
            }

            // Move the elements if necessary
            if (headDeleteLen != insertLen)
            {
                uint32 noElementsToMove = seg->length - (relativeStart + headDeleteLen);
                MoveArray(seg->elements + relativeStart + insertLen,
                            seg->elements + relativeStart + headDeleteLen,
                            noElementsToMove);
                if (newHeadLen < seg->length) // truncate if necessary
                {
                    seg->Truncate(seg->left + newHeadLen); // set end elements to null so that when we introduce null elements we are safe
                }
                seg->length = newHeadLen;
                seg->CheckLengthvsSize();
            }
            // Copy the new elements
            if (insertLen > 0)
            {
                Assert(!VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(pnewArr) &&
                   !VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(pnewArr));

                // inserted elements starts at argument 3 of splice(start, deleteNumber, insertelem1, insertelem2, insertelem3, ...);
                CopyArray(seg->elements + relativeStart, insertLen,
                          reinterpret_cast<const T*>(insertArgs), insertLen);
            }
            *prev = seg;
        }
        else
        {
            *prev = SparseArraySegment<T>::From(seg->next);
        }
    }